

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestComparisonsF<Counter<unsigned_long,48u>>(void)

{
  Counter<unsigned_long,_48U> CVar1;
  Counter<unsigned_long,_48U> local_780;
  Counter<unsigned_long,_48U> local_778;
  Counter<unsigned_long,_48U> local_770;
  Counter<unsigned_long,_48U> local_768;
  Counter<unsigned_long,_48U> local_760;
  Counter<unsigned_long,_48U> local_758;
  Counter<unsigned_long,_48U> local_750;
  Counter<unsigned_long,_48U> local_748;
  Counter<unsigned_long,_48U> local_740;
  Counter<unsigned_long,_48U> local_738;
  Counter<unsigned_long,_48U> local_730;
  Counter<unsigned_long,_48U> local_728;
  Counter<unsigned_long,_48U> local_720;
  Counter<unsigned_long,_48U> local_718;
  Counter<unsigned_long,_48U> local_710;
  Counter<unsigned_long,_48U> local_708;
  Counter<unsigned_long,_48U> local_700;
  Counter<unsigned_long,_48U> local_6f8;
  Counter<unsigned_long,_48U> local_6f0;
  Counter<unsigned_long,_48U> local_6e8;
  Counter<unsigned_long,_48U> local_6e0;
  Counter<unsigned_long,_48U> local_6d8;
  Counter<unsigned_long,_48U> local_6d0;
  Counter<unsigned_long,_48U> local_6c8;
  Counter<unsigned_long,_48U> local_6c0;
  Counter<unsigned_long,_48U> local_6b8;
  Counter<unsigned_long,_48U> local_6b0;
  Counter<unsigned_long,_48U> local_6a8;
  Counter<unsigned_long,_48U> local_6a0;
  uint local_694;
  uint ii_1;
  Counter<unsigned_long,_48U> local_688;
  Counter<unsigned_long,_48U> local_680;
  Counter<unsigned_long,_48U> local_678;
  Counter<unsigned_long,_48U> local_670;
  Counter<unsigned_long,_48U> local_668;
  Counter<unsigned_long,_48U> local_660;
  Counter<unsigned_long,_48U> local_658;
  Counter<unsigned_long,_48U> local_650;
  Counter<unsigned_long,_48U> local_648;
  Counter<unsigned_long,_48U> local_640;
  Counter<unsigned_long,_48U> local_638;
  Counter<unsigned_long,_48U> local_630;
  Counter<unsigned_long,_48U> local_628;
  Counter<unsigned_long,_48U> local_620;
  Counter<unsigned_long,_48U> local_618;
  Counter<unsigned_long,_48U> local_610;
  Counter<unsigned_long,_48U> local_608;
  Counter<unsigned_long,_48U> local_600;
  Counter<unsigned_long,_48U> local_5f8;
  Counter<unsigned_long,_48U> local_5f0;
  Counter<unsigned_long,_48U> local_5e8;
  Counter<unsigned_long,_48U> local_5e0;
  Counter<unsigned_long,_48U> local_5d8;
  Counter<unsigned_long,_48U> local_5d0;
  Counter<unsigned_long,_48U> local_5c8;
  Counter<unsigned_long,_48U> local_5c0;
  Counter<unsigned_long,_48U> local_5b8;
  Counter<unsigned_long,_48U> local_5b0;
  uint local_5a8;
  uint local_5a4;
  uint ii;
  uint sep;
  Counter<unsigned_long,_48U> local_598;
  Counter<unsigned_long,_48U> local_590;
  Counter<unsigned_long,_48U> local_588;
  Counter<unsigned_long,_48U> local_580;
  Counter<unsigned_long,_48U> local_578;
  Counter<unsigned_long,_48U> c;
  Counter<unsigned_long,_48U> b;
  Counter<unsigned_long,_48U> a;
  unsigned_long d_20;
  unsigned_long d_19;
  unsigned_long d_18;
  unsigned_long d_2;
  unsigned_long d_1;
  unsigned_long d;
  unsigned_long d_26;
  unsigned_long d_25;
  unsigned_long d_24;
  unsigned_long d_23;
  unsigned_long d_22;
  unsigned_long d_21;
  unsigned_long d_8;
  unsigned_long d_7;
  unsigned_long d_6;
  unsigned_long d_5;
  unsigned_long d_4;
  unsigned_long d_3;
  unsigned_long d_29;
  unsigned_long d_28;
  unsigned_long d_27;
  unsigned_long d_11;
  unsigned_long d_10;
  unsigned_long d_9;
  unsigned_long d_35;
  unsigned_long d_34;
  unsigned_long d_33;
  unsigned_long d_32;
  unsigned_long d_31;
  unsigned_long d_30;
  unsigned_long d_17;
  unsigned_long d_16;
  unsigned_long d_15;
  unsigned_long d_14;
  unsigned_long d_13;
  unsigned_long d_12;
  unsigned_long oldValue_1;
  unsigned_long oldValue;
  unsigned_long oldValue_3;
  unsigned_long oldValue_2;
  
  Counter<unsigned_long,_48U>::Counter(&b,2);
  Counter<unsigned_long,_48U>::Counter(&c,2);
  Counter<unsigned_long,_48U>::Counter(&local_578,3);
  Counter<unsigned_long,_48U>::Counter(&local_580,&c);
  if (b.Value == local_580.Value) {
    Counter<unsigned_long,_48U>::Counter(&local_588,&local_578);
    if (c.Value == local_588.Value) {
      a.Value._7_1_ = false;
    }
    else {
      Counter<unsigned_long,_48U>::Counter(&local_590,&local_578);
      Counter<unsigned_long,_48U>::operator=(&c,&local_590);
      Counter<unsigned_long,_48U>::Counter(&local_598,&local_578);
      if (c.Value == local_598.Value) {
        Counter<unsigned_long,_48U>::Counter((Counter<unsigned_long,_48U> *)&ii,&c);
        if (b.Value == _ii) {
          a.Value._7_1_ = false;
        }
        else {
          for (local_5a4 = 0; local_5a4 < 3; local_5a4 = local_5a4 + 1) {
            Counter<unsigned_long,_48U>::operator=(&b,0xffffffffffff - (ulong)local_5a4);
            Counter<unsigned_long,_48U>::operator=(&c,0);
            Counter<unsigned_long,_48U>::operator=(&local_578,(ulong)(local_5a4 + 1));
            for (local_5a8 = 0; local_5a8 < 1000; local_5a8 = local_5a8 + 1) {
              Counter<unsigned_long,_48U>::Counter(&local_5b0,&b);
              if (b.Value != local_5b0.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_5b8,&c);
              if (c.Value != local_5b8.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_5c0,&local_578);
              if (local_578.Value != local_5c0.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_5c8,&c);
              if (b.Value == local_5c8.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_5d0,&local_578);
              if (b.Value == local_5d0.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_5d8,&b);
              if (c.Value == local_5d8.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_5e0,&local_578);
              if (c.Value == local_5e0.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_5e8,&b);
              if (local_578.Value == local_5e8.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_5f0,&c);
              if (local_578.Value == local_5f0.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_5f8,&c);
              if ((b.Value - local_5f8.Value & 0xffffffffffff) < 0x800000000000) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_600,&local_578);
              if ((b.Value - local_600.Value & 0xffffffffffff) < 0x800000000000) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_608,&local_578);
              if ((c.Value - local_608.Value & 0xffffffffffff) < 0x800000000000) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_610,&c);
              if (0x7fffffffffff < (local_610.Value - b.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_618,&local_578);
              if (0x7fffffffffff < (local_618.Value - b.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_620,&local_578);
              if (0x7fffffffffff < (local_620.Value - c.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_628,&b);
              if (0x7fffffffffff < (local_628.Value - b.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_630,&c);
              if (0x7fffffffffff < (local_630.Value - c.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_638,&local_578);
              if (0x7fffffffffff < (local_638.Value - local_578.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_640,&b);
              if ((local_640.Value - c.Value & 0xffffffffffff) < 0x800000000000) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_648,&b);
              if ((local_648.Value - local_578.Value & 0xffffffffffff) < 0x800000000000) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_650,&c);
              if ((local_650.Value - local_578.Value & 0xffffffffffff) < 0x800000000000) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_658,&b);
              if (0x7fffffffffff < (c.Value - local_658.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_660,&b);
              if (0x7fffffffffff < (local_578.Value - local_660.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_668,&c);
              if (0x7fffffffffff < (local_578.Value - local_668.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_670,&b);
              if (0x7fffffffffff < (b.Value - local_670.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_678,&c);
              if (0x7fffffffffff < (c.Value - local_678.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_680,&local_578);
              CVar1 = b;
              if (0x7fffffffffff < (local_578.Value - local_680.Value & 0xffffffffffff)) {
                return false;
              }
              b.Value = b.Value + 1 & 0xffffffffffff;
              Counter<unsigned_long,_48U>::Counter(&local_688,CVar1.Value);
              CVar1.Value = local_578.Value;
              c.Value = c.Value + 1 & 0xffffffffffff;
              local_578.Value = local_578.Value + 1 & 0xffffffffffff;
              Counter<unsigned_long,_48U>::Counter
                        ((Counter<unsigned_long,_48U> *)&stack0xfffffffffffff970,CVar1.Value);
            }
            for (local_694 = 0; local_694 < 2000; local_694 = local_694 + 1) {
              Counter<unsigned_long,_48U>::Counter(&local_6a0,&b);
              if (b.Value != local_6a0.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_6a8,&c);
              if (c.Value != local_6a8.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_6b0,&local_578);
              if (local_578.Value != local_6b0.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_6b8,&c);
              if (b.Value == local_6b8.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_6c0,&local_578);
              if (b.Value == local_6c0.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_6c8,&b);
              if (c.Value == local_6c8.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_6d0,&local_578);
              if (c.Value == local_6d0.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_6d8,&b);
              if (local_578.Value == local_6d8.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_6e0,&c);
              if (local_578.Value == local_6e0.Value) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_6e8,&c);
              if ((b.Value - local_6e8.Value & 0xffffffffffff) < 0x800000000000) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_6f0,&local_578);
              if ((b.Value - local_6f0.Value & 0xffffffffffff) < 0x800000000000) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_6f8,&local_578);
              if ((c.Value - local_6f8.Value & 0xffffffffffff) < 0x800000000000) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_700,&c);
              if (0x7fffffffffff < (local_700.Value - b.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_708,&local_578);
              if (0x7fffffffffff < (local_708.Value - b.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_710,&local_578);
              if (0x7fffffffffff < (local_710.Value - c.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_718,&b);
              if (0x7fffffffffff < (local_718.Value - b.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_720,&c);
              if (0x7fffffffffff < (local_720.Value - c.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_728,&local_578);
              if (0x7fffffffffff < (local_728.Value - local_578.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_730,&b);
              if ((local_730.Value - c.Value & 0xffffffffffff) < 0x800000000000) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_738,&b);
              if ((local_738.Value - local_578.Value & 0xffffffffffff) < 0x800000000000) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_740,&c);
              if ((local_740.Value - local_578.Value & 0xffffffffffff) < 0x800000000000) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_748,&b);
              if (0x7fffffffffff < (c.Value - local_748.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_750,&b);
              if (0x7fffffffffff < (local_578.Value - local_750.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_758,&c);
              if (0x7fffffffffff < (local_578.Value - local_758.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_760,&b);
              if (0x7fffffffffff < (b.Value - local_760.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_768,&c);
              if (0x7fffffffffff < (c.Value - local_768.Value & 0xffffffffffff)) {
                return false;
              }
              Counter<unsigned_long,_48U>::Counter(&local_770,&local_578);
              CVar1 = b;
              if (0x7fffffffffff < (local_578.Value - local_770.Value & 0xffffffffffff)) {
                return false;
              }
              b.Value = b.Value - 1 & 0xffffffffffff;
              Counter<unsigned_long,_48U>::Counter(&local_778,CVar1.Value);
              CVar1.Value = local_578.Value;
              c.Value = c.Value - 1 & 0xffffffffffff;
              local_578.Value = local_578.Value - 1 & 0xffffffffffff;
              Counter<unsigned_long,_48U>::Counter(&local_780,CVar1.Value);
            }
          }
          a.Value._7_1_ = true;
        }
      }
      else {
        a.Value._7_1_ = false;
      }
    }
  }
  else {
    a.Value._7_1_ = false;
  }
  return a.Value._7_1_;
}

Assistant:

bool TestComparisonsF()
{
    CounterT a = 2, b = 2, c = 3;
    TEST_CHECK(a == b);
    TEST_CHECK(b != c);
    b = c;
    TEST_CHECK(b == c);
    TEST_CHECK(a != b);

    for (unsigned sep = 0; sep < 3; ++sep)
    {
        a = CounterT::kMask - sep;
        b = 0;
        c = 1 + sep;

        for (unsigned ii = 0; ii < 1000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a++;
            ++b;
            c++;
        }

        for (unsigned ii = 0; ii < 2000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a--;
            --b;
            c--;
        }
    }

    return true;
}